

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLObjectWrapper.hpp
# Opt level: O0

void __thiscall
GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLQueryCreateReleaseHelper>::GLObjWrapper
          (GLObjWrapper<GLObjectWrappers::GLQueryCreateReleaseHelper> *this,byte CreateObject)

{
  bool CreateObject_local;
  GLObjWrapper<GLObjectWrappers::GLQueryCreateReleaseHelper> *this_local;
  
  this->m_uiHandle = 0;
  Diligent::UniqueIdHelper<GLObjectWrappers::GLQueryCreateReleaseHelper>::UniqueIdHelper
            (&this->m_UniqueId);
  if (((CreateObject & 1) != 0) && (Create(this), this->m_uiHandle == 0)) {
    Diligent::LogError<true,char[18],char_const*,char[11]>
              (false,"GLObjWrapper",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLObjectWrapper.hpp"
               ,0x32,(char (*) [18])"Failed to create ",(char **)&GLQueryCreateReleaseHelper::Name,
               (char (*) [11])0xe5d75d);
  }
  return;
}

Assistant:

explicit GLObjWrapper(bool CreateObject, CreateReleaseHelperType CreateReleaseHelper = CreateReleaseHelperType()) :
        // clang-format off
        m_uiHandle           {0                  },
        m_CreateReleaseHelper{CreateReleaseHelper}
    // clang-format on
    {
        if (CreateObject)
        {
            Create();
            if (!m_uiHandle)
            {
                LOG_ERROR_AND_THROW("Failed to create ", m_CreateReleaseHelper.Name, " GL object");
            }
        }
    }